

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Content * build_model(XML_Parser parser)

{
  uint uVar1;
  uint uVar2;
  DTD *pDVar3;
  uint local_68;
  uint local_64;
  int cn;
  uint i;
  XML_Char *src;
  XML_Content *pXStack_50;
  int src_node;
  XML_Content *jobDest;
  XML_Content *destLimit;
  XML_Content *dest;
  size_t allocsize;
  XML_Char *str;
  XML_Content *ret;
  DTD *dtd;
  XML_Parser parser_local;
  
  pDVar3 = parser->m_dtd;
  if (-(ulong)pDVar3->contentStringLen - 1 < (ulong)pDVar3->scaffCount << 5) {
    parser_local = (XML_Parser)0x0;
  }
  else {
    parser_local = (XML_Parser)
                   (*(parser->m_mem).malloc_fcn)
                             ((ulong)pDVar3->scaffCount * 0x20 + (ulong)pDVar3->contentStringLen);
    if (parser_local == (XML_Parser)0x0) {
      parser_local = (XML_Parser)0x0;
    }
    else {
      uVar1 = pDVar3->scaffCount;
      allocsize = (size_t)(&parser_local->m_userData + (ulong)pDVar3->scaffCount * 4);
      pXStack_50 = (XML_Content *)&(parser_local->m_mem).realloc_fcn;
      *(uint *)&parser_local->m_buffer = 0;
      for (destLimit = (XML_Content *)parser_local;
          destLimit < (XML_Content *)(&parser_local->m_userData + (ulong)uVar1 * 4);
          destLimit = destLimit + 1) {
        uVar2 = destLimit->numchildren;
        destLimit->type = pDVar3->scaffold[(int)uVar2].type;
        destLimit->quant = pDVar3->scaffold[(int)uVar2].quant;
        if (destLimit->type == XML_CTYPE_NAME) {
          destLimit->name = (XML_Char *)allocsize;
          _cn = pDVar3->scaffold[(int)uVar2].name;
          while( true ) {
            *(char *)allocsize = *_cn;
            if (*_cn == '\0') break;
            _cn = _cn + 1;
            allocsize = allocsize + 1;
          }
          destLimit->numchildren = 0;
          destLimit->children = (XML_Content *)0x0;
          allocsize = allocsize + 1;
        }
        else {
          destLimit->name = (XML_Char *)0x0;
          destLimit->numchildren = pDVar3->scaffold[(int)uVar2].childcnt;
          destLimit->children = pXStack_50;
          local_64 = 0;
          local_68 = pDVar3->scaffold[(int)uVar2].firstchild;
          for (; local_64 < destLimit->numchildren; local_64 = local_64 + 1) {
            pXStack_50->numchildren = local_68;
            local_68 = pDVar3->scaffold[(int)local_68].nextsib;
            pXStack_50 = pXStack_50 + 1;
          }
        }
      }
    }
  }
  return (XML_Content *)parser_local;
}

Assistant:

static XML_Content *
build_model(XML_Parser parser) {
  /* Function build_model transforms the existing parser->m_dtd->scaffold
   * array of CONTENT_SCAFFOLD tree nodes into a new array of
   * XML_Content tree nodes followed by a gapless list of zero-terminated
   * strings. */
  DTD *const dtd = parser->m_dtd; /* save one level of indirection */
  XML_Content *ret;
  XML_Char *str; /* the current string writing location */

  /* Detect and prevent integer overflow.
   * The preprocessor guard addresses the "always false" warning
   * from -Wtype-limits on platforms where
   * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#if UINT_MAX >= SIZE_MAX
  if (dtd->scaffCount > (size_t)(-1) / sizeof(XML_Content)) {
    return NULL;
  }
  if (dtd->contentStringLen > (size_t)(-1) / sizeof(XML_Char)) {
    return NULL;
  }
#endif
  if (dtd->scaffCount * sizeof(XML_Content)
      > (size_t)(-1) - dtd->contentStringLen * sizeof(XML_Char)) {
    return NULL;
  }

  const size_t allocsize = (dtd->scaffCount * sizeof(XML_Content)
                            + (dtd->contentStringLen * sizeof(XML_Char)));

  ret = (XML_Content *)MALLOC(parser, allocsize);
  if (! ret)
    return NULL;

  /* What follows is an iterative implementation (of what was previously done
   * recursively in a dedicated function called "build_node".  The old recursive
   * build_node could be forced into stack exhaustion from input as small as a
   * few megabyte, and so that was a security issue.  Hence, a function call
   * stack is avoided now by resolving recursion.)
   *
   * The iterative approach works as follows:
   *
   * - We have two writing pointers, both walking up the result array; one does
   *   the work, the other creates "jobs" for its colleague to do, and leads
   *   the way:
   *
   *   - The faster one, pointer jobDest, always leads and writes "what job
   *     to do" by the other, once they reach that place in the
   *     array: leader "jobDest" stores the source node array index (relative
   *     to array dtd->scaffold) in field "numchildren".
   *
   *   - The slower one, pointer dest, looks at the value stored in the
   *     "numchildren" field (which actually holds a source node array index
   *     at that time) and puts the real data from dtd->scaffold in.
   *
   * - Before the loop starts, jobDest writes source array index 0
   *   (where the root node is located) so that dest will have something to do
   *   when it starts operation.
   *
   * - Whenever nodes with children are encountered, jobDest appends
   *   them as new jobs, in order.  As a result, tree node siblings are
   *   adjacent in the resulting array, for example:
   *
   *     [0] root, has two children
   *       [1] first child of 0, has three children
   *         [3] first child of 1, does not have children
   *         [4] second child of 1, does not have children
   *         [5] third child of 1, does not have children
   *       [2] second child of 0, does not have children
   *
   *   Or (the same data) presented in flat array view:
   *
   *     [0] root, has two children
   *
   *     [1] first child of 0, has three children
   *     [2] second child of 0, does not have children
   *
   *     [3] first child of 1, does not have children
   *     [4] second child of 1, does not have children
   *     [5] third child of 1, does not have children
   *
   * - The algorithm repeats until all target array indices have been processed.
   */
  XML_Content *dest = ret; /* tree node writing location, moves upwards */
  XML_Content *const destLimit = &ret[dtd->scaffCount];
  XML_Content *jobDest = ret; /* next free writing location in target array */
  str = (XML_Char *)&ret[dtd->scaffCount];

  /* Add the starting job, the root node (index 0) of the source tree  */
  (jobDest++)->numchildren = 0;

  for (; dest < destLimit; dest++) {
    /* Retrieve source tree array index from job storage */
    const int src_node = (int)dest->numchildren;

    /* Convert item */
    dest->type = dtd->scaffold[src_node].type;
    dest->quant = dtd->scaffold[src_node].quant;
    if (dest->type == XML_CTYPE_NAME) {
      const XML_Char *src;
      dest->name = str;
      src = dtd->scaffold[src_node].name;
      for (;;) {
        *str++ = *src;
        if (! *src)
          break;
        src++;
      }
      dest->numchildren = 0;
      dest->children = NULL;
    } else {
      unsigned int i;
      int cn;
      dest->name = NULL;
      dest->numchildren = dtd->scaffold[src_node].childcnt;
      dest->children = jobDest;

      /* Append scaffold indices of children to array */
      for (i = 0, cn = dtd->scaffold[src_node].firstchild;
           i < dest->numchildren; i++, cn = dtd->scaffold[cn].nextsib)
        (jobDest++)->numchildren = (unsigned int)cn;
    }
  }

  return ret;
}